

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.cpp
# Opt level: O2

void __thiscall
HTTP::HTTP(HTTP *this,string *host,unsigned_short port,string *path,IPAddress *outgoing)

{
  int iVar1;
  Client *pCVar2;
  string request;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->response)._M_dataplus._M_p = (pointer)&(this->response).field_2;
  (this->response)._M_string_length = 0;
  (this->response).field_2._M_local_buf[0] = '\0';
  request._M_dataplus._M_p = (pointer)&request.field_2;
  request._M_string_length = 0;
  request.field_2._M_local_buf[0] = '\0';
  this->status = 0;
  this->done = false;
  std::operator+(&local_b0,"GET ",path);
  std::operator+(&local_90,&local_b0," HTTP/1.1\r\nHost: ");
  std::operator+(&local_70,&local_90,host);
  std::operator+(&local_50,&local_70,
                 "\r\nUser-Agent: EOSERV\r\nAccept: */*\r\nAccept-Encoding: \r\nConnection: close\r\n\r\n"
                );
  std::__cxx11::string::operator=((string *)&request,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  pCVar2 = (Client *)operator_new(0xa0);
  Client::Client(pCVar2);
  this->client = pCVar2;
  if (outgoing->address != 0) {
    pCVar2 = this->client;
    iVar1 = util::rand();
    Client::Bind(pCVar2,outgoing,(uint16_t)iVar1);
    pCVar2 = this->client;
  }
  Client::SetSendBuffer(pCVar2,0x2000);
  Client::SetRecvBuffer(this->client,0x2000);
  pCVar2 = this->client;
  std::__cxx11::string::string((string *)&local_d0,(string *)host);
  local_50._M_dataplus._M_p._0_4_ = IPAddress::Lookup(&local_d0);
  Client::Connect(pCVar2,(IPAddress *)&local_50,port);
  std::__cxx11::string::~string((string *)&local_d0);
  this->done = false;
  Client::Send(this->client,&request);
  std::__cxx11::string::~string((string *)&request);
  return;
}

Assistant:

HTTP::HTTP(std::string host, unsigned short port, std::string path, const IPAddress & outgoing)
{
	std::string request;

	this->status = 0;
	this->done = false;

	request = "GET " + path + " HTTP/1.1\r\n"
	"Host: " + host + "\r\n"
	"User-Agent: EOSERV\r\n"
	"Accept: */*\r\n"
	"Accept-Encoding: \r\n"
	"Connection: close\r\n"
	"\r\n";

	client = new Client;

	if (static_cast<unsigned int>(outgoing) != 0)
	{
		int retry = 0;

		while (true)
		{
			try
			{
				client->Bind(outgoing, util::rand(49152, 65535));
				break;
			}
			catch (Socket_BindFailed &e)
			{
				if (++retry >= 10)
					throw;
			}
		}
	}

	client->SetSendBuffer(8192);
	client->SetRecvBuffer(8192);

	client->Connect(IPAddress::Lookup(host), port);

	this->done = false;

	client->Send(request);
}